

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool ParseCSS1Selector(TidyDocImpl *doc,TidyOptionImpl *option)

{
  tchar c;
  Bool BVar1;
  ctmbstr val;
  TidyOptionId optId;
  ulong uVar2;
  char buf [256];
  
  val = buf;
  memset(buf,0,0x100);
  if ((doc->config).c == 0xffffffff) {
    optId = option->id;
    val = (ctmbstr)0x0;
  }
  else {
    c = SkipWhite(&doc->config);
    uVar2 = 0;
    while (((uVar2 < 0xfe && (c != 0xffffffff)) && (BVar1 = prvTidyIsWhite(c), BVar1 == no))) {
      buf[uVar2] = (char)c;
      uVar2 = uVar2 + 1;
      c = AdvanceChar(&doc->config);
    }
    buf[uVar2] = '\0';
    if (uVar2 == 0) {
      return no;
    }
    BVar1 = prvTidyIsCSS1Selector(buf);
    if (BVar1 == no) {
      prvTidyReportBadArgument(doc,option->name);
      return no;
    }
    buf[uVar2] = '\0';
    optId = option->id;
  }
  SetOptionValue(doc,optId,val);
  return yes;
}

Assistant:

Bool ParseCSS1Selector( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    char buf[256] = {0};
    uint i = 0;
    uint c;

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
    {
        SetOptionValue( doc, option->id, NULL );
        return yes;
    }

    c = SkipWhite( cfg );

    while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) )
    {
        buf[i++] = (tmbchar) c;
        c = AdvanceChar( &doc->config );
    }
    buf[i] = '\0';

    if ( i == 0 ) {
        return no;
    }
    else if ( !TY_(IsCSS1Selector)(buf) ) {
        TY_(ReportBadArgument)( doc, option->name );
        return no;
    }

    buf[i] = 0; /* Is #697 - Do *not* add '-' */
#if 0   /* Is #697 - Is this still required? KEEP HISTORY - DO NOT DELETE */
    buf[i++] = '-';  /* Make sure any escaped Unicode is terminated */
    buf[i] = 0;      /* so valid class names are generated after */
                     /* Tidy appends last digits. */
#endif /* Is #697 - Is this still required? */

    SetOptionValue( doc, option->id, buf );
    return yes;
}